

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void __thiscall
bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack
          (MRUQueue<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord t)

{
  DTLSSentRecord DVar1;
  size_t sVar2;
  DTLSSentRecord *pDVar3;
  MRUQueue<bssl::DTLSSentRecord,_32UL> *this_local;
  
  DVar1 = t;
  sVar2 = InplaceVector<bssl::DTLSSentRecord,_32UL>::size(&this->storage_);
  if (sVar2 < 0x20) {
    if (this->start_ != '\0') {
      __assert_fail("start_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                    ,100,
                    "void bssl::MRUQueue<bssl::DTLSSentRecord, 32>::PushBack(T) [T = bssl::DTLSSentRecord, N = 32]"
                   );
    }
    InplaceVector<bssl::DTLSSentRecord,_32UL>::PushBack(&this->storage_,t);
  }
  else {
    pDVar3 = operator[](this,0);
    (pDVar3->number).combined_ = t.number.combined_;
    pDVar3->first_msg = t.first_msg;
    pDVar3->last_msg = t.last_msg;
    *(undefined2 *)&pDVar3->field_0xa = t._10_2_;
    pDVar3->first_msg_start = t.first_msg_start;
    t.last_msg_end = DVar1.last_msg_end;
    pDVar3->last_msg_end = t.last_msg_end;
    this->start_ = this->start_ + 1 & 0x1f;
  }
  return;
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }